

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_grab.cxx
# Opt level: O1

void Fl::grab(Fl_Window *win)

{
  Fl_Window *pFVar1;
  int iVar2;
  Fl_Window *window;
  Window WVar3;
  
  for (window = first_window(); window != (Fl_Window *)0x0; window = next_window(window)) {
    if (((window->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0) goto LAB_001dfe50;
  }
  window = (Fl_Window *)0x0;
LAB_001dfe50:
  if (win == (Fl_Window *)0x0) {
    pFVar1 = grab_;
    if (grab_ != (Fl_Window *)0x0) {
      if ((window == (Fl_Window *)0x0) || (iVar2 = Fl_X::ewmh_supported(), iVar2 != 0)) {
        XUngrabKeyboard(fl_display,fl_event_time);
      }
      XUngrabPointer(fl_display,fl_event_time);
      XFlush(fl_display);
      grab_ = (Fl_Window *)0x0;
      fl_fix_focus();
      return;
    }
  }
  else {
    pFVar1 = win;
    if (grab_ == (Fl_Window *)0x0) {
      if (window == (Fl_Window *)0x0) {
        window = first_window();
      }
      if (window->i == (Fl_X *)0x0) {
        WVar3 = 0;
      }
      else {
        WVar3 = window->i->xid;
      }
      XGrabPointer(fl_display,WVar3,1,0x204c,1,1,0,0,fl_event_time);
      XGrabKeyboard(fl_display,WVar3,1,1,1,fl_event_time);
      pFVar1 = win;
    }
  }
  grab_ = pFVar1;
  return;
}

Assistant:

void Fl::grab(Fl_Window* win) {
#ifdef USE_X11
    Fl_Window *fullscreen_win = NULL;
    for (Fl_Window *W = Fl::first_window(); W; W = Fl::next_window(W)) {
      if (W->fullscreen_active()) {
        fullscreen_win = W;
        break;
      }
    }
#endif
  if (win) {
    if (!grab_) {
#ifdef WIN32
      SetActiveWindow(fl_capture = fl_xid(first_window()));
      SetCapture(fl_capture);
#elif defined(__APPLE__)
      fl_capture = Fl_X::i(first_window())->xid;
      Fl_X::i(first_window())->set_key_window();
#else
      Window xid = fullscreen_win ? fl_xid(fullscreen_win) : fl_xid(first_window());
      XGrabPointer(fl_display,
		   xid,
		   1,
		   ButtonPressMask|ButtonReleaseMask|
		   ButtonMotionMask|PointerMotionMask,
		   GrabModeAsync,
		   GrabModeAsync, 
		   None,
		   0,
		   fl_event_time);
      XGrabKeyboard(fl_display,
		    xid,
		    1,
		    GrabModeAsync,
		    GrabModeAsync, 
		    fl_event_time);
#endif
    }
    grab_ = win;
  } else {
    if (grab_) {
#ifdef WIN32
      fl_capture = 0;
      ReleaseCapture();
#elif defined(__APPLE__)
      fl_capture = 0;
#else
      // We must keep the grab in the non-EWMH fullscreen case
      if (!fullscreen_win || Fl_X::ewmh_supported()) {
      XUngrabKeyboard(fl_display, fl_event_time);
      }
      XUngrabPointer(fl_display, fl_event_time);
      // this flush is done in case the picked menu item goes into
      // an infinite loop, so we don't leave the X server locked up:
      XFlush(fl_display);
#endif
      grab_ = 0;
      fl_fix_focus();
    }
  }
}